

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::moveAppend
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          X509CertificateExtension *b,X509CertificateExtension *e)

{
  undefined8 *puVar1;
  X509CertificateExtension *pXVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  PrivateShared *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  qsizetype qVar10;
  
  if ((b != e) && (b < e)) {
    pXVar2 = (this->
             super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
             ptr;
    qVar10 = (this->
             super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
             size;
    do {
      pDVar3 = (b->oid).d.d;
      (b->oid).d.d = (Data *)0x0;
      pXVar2[qVar10].oid.d.d = pDVar3;
      pcVar4 = (b->oid).d.ptr;
      (b->oid).d.ptr = (char16_t *)0x0;
      pXVar2[qVar10].oid.d.ptr = pcVar4;
      qVar5 = (b->oid).d.size;
      (b->oid).d.size = 0;
      pXVar2[qVar10].oid.d.size = qVar5;
      pDVar3 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pXVar2[qVar10].name.d.d = pDVar3;
      pcVar4 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pXVar2[qVar10].name.d.ptr = pcVar4;
      qVar5 = (b->name).d.size;
      (b->name).d.size = 0;
      pXVar2[qVar10].name.d.size = qVar5;
      pPVar6 = (b->value).d.data.shared;
      uVar7 = *(undefined8 *)((long)&(b->value).d.data + 8);
      uVar8 = *(undefined8 *)&(b->value).d.field_0x18;
      puVar1 = (undefined8 *)((long)&pXVar2[qVar10].value.d.data + 0x10);
      *puVar1 = *(undefined8 *)((long)&(b->value).d.data + 0x10);
      puVar1[1] = uVar8;
      pXVar2[qVar10].value.d.data.shared = pPVar6;
      *(undefined8 *)((long)&pXVar2[qVar10].value.d.data + 8) = uVar7;
      (b->value).d.data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(b->value).d.data + 8) = 0;
      *(undefined8 *)((long)&(b->value).d.data + 0x10) = 0;
      *(undefined8 *)&(b->value).d.field_0x18 = 2;
      bVar9 = b->supported;
      pXVar2[qVar10].critical = b->critical;
      pXVar2[qVar10].supported = bVar9;
      b = b + 1;
      qVar10 = (this->
               super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
               size + 1;
      (this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
      size = qVar10;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }